

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestAllTypes::clear_oneof_field(TestAllTypes *this)

{
  TestAllTypes_NestedMessage *pTVar1;
  OneofFieldCase OVar2;
  Arena *pAVar3;
  TestAllTypes *this_local;
  
  OVar2 = oneof_field_case(this);
  if ((OVar2 != ONEOF_FIELD_NOT_SET) && (OVar2 != kOneofUint32)) {
    if (OVar2 == kOneofNestedMessage) {
      pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      if (pAVar3 == (Arena *)0x0) {
        pTVar1 = *(TestAllTypes_NestedMessage **)((long)&this->field_0 + 0x368);
        if (pTVar1 != (TestAllTypes_NestedMessage *)0x0) {
          edition_unittest::TestAllTypes_NestedMessage::~TestAllTypes_NestedMessage(pTVar1);
          operator_delete(pTVar1,0x20);
        }
      }
      else {
        google::protobuf::internal::MaybePoisonAfterClear
                  (&((this->field_0)._impl_.oneof_field_.oneof_nested_message_)->super_Message);
      }
    }
    else if (OVar2 == kOneofString) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar2 == kOneofBytes) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar2 == kOneofCord) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar2 == kOneofStringPiece) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar2 == kOneofLazyNestedMessage) {
      pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      if (pAVar3 == (Arena *)0x0) {
        pTVar1 = *(TestAllTypes_NestedMessage **)((long)&this->field_0 + 0x368);
        if (pTVar1 != (TestAllTypes_NestedMessage *)0x0) {
          edition_unittest::TestAllTypes_NestedMessage::~TestAllTypes_NestedMessage(pTVar1);
          operator_delete(pTVar1,0x20);
        }
      }
      else {
        google::protobuf::internal::MaybePoisonAfterClear
                  (&((this->field_0)._impl_.oneof_field_.oneof_nested_message_)->super_Message);
      }
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestAllTypes::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:edition_unittest.TestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofUint32: {
      // No need to clear
      break;
    }
    case kOneofNestedMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_nested_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.oneof_nested_message_);
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case kOneofCord: {
      _impl_.oneof_field_.oneof_cord_.Destroy();
      break;
    }
    case kOneofStringPiece: {
      _impl_.oneof_field_.oneof_string_piece_.Destroy();
      break;
    }
    case kOneofLazyNestedMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_lazy_nested_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.oneof_lazy_nested_message_);
      }
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}